

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::BinaryExpression::getEffectiveWidthImpl(BinaryExpression *this)

{
  _Optional_payload_base<unsigned_int> *p_Var1;
  BinaryExpression *in_RDI;
  Expression *in_stack_ffffffffffffffc8;
  BinaryOperator BVar2;
  undefined4 in_stack_ffffffffffffffdc;
  _Optional_payload_base<unsigned_int> local_8;
  
  BVar2 = in_RDI->op;
  if (BVar2 < Equality) {
    left(in_RDI);
    Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
    right(in_RDI);
    Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
    p_Var1 = (_Optional_payload_base<unsigned_int> *)
             std::max<std::optional<unsigned_int>>
                       ((optional<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffdc,BVar2),
                        (optional<unsigned_int> *)in_RDI);
    local_8 = *p_Var1;
  }
  else if (BVar2 - Equality < 0xe) {
    std::optional<unsigned_int>::optional<int,_true>
              ((optional<unsigned_int> *)in_RDI,(int *)in_stack_ffffffffffffffc8);
  }
  else {
    left(in_RDI);
    local_8 = (_Optional_payload_base<unsigned_int>)
              Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> BinaryExpression::getEffectiveWidthImpl() const {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return 1;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            return left().getEffectiveWidth();
    }
    SLANG_UNREACHABLE;
}